

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O0

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::Pattern::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,Pattern *this)

{
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  SingleMthdTest *this_00;
  result_type rVar1;
  MthdNotify *this_01;
  MthdPmTrigger *this_02;
  MthdDmaNotify *this_03;
  MthdMissing *this_04;
  MthdCtxFormat *this_05;
  MthdBitmapFormat *this_06;
  MthdPatternShape *this_07;
  MthdPatternBitmapColor *pMVar2;
  MthdPatternBitmap *pMVar3;
  allocator<hwtest::pgraph::SingleMthdTest_*> local_273;
  undefined1 local_272;
  allocator local_271;
  string local_270 [38];
  undefined1 local_24a;
  allocator local_249;
  string local_248 [38];
  undefined1 local_222;
  allocator local_221;
  string local_220 [38];
  undefined1 local_1fa;
  allocator local_1f9;
  string local_1f8 [38];
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [38];
  undefined1 local_1aa;
  allocator local_1a9;
  string local_1a8 [38];
  undefined1 local_182;
  allocator local_181;
  string local_180 [38];
  undefined1 local_15a;
  allocator local_159;
  string local_158 [38];
  undefined1 local_132;
  allocator local_131;
  string local_130 [38];
  undefined1 local_10a;
  allocator local_109;
  string local_108 [38];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0 [38];
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [48];
  SingleMthdTest *local_88;
  MthdNotify *local_80;
  MthdPmTrigger *local_78;
  MthdDmaNotify *local_70;
  MthdMissing *local_68;
  MthdCtxFormat *local_60;
  MthdBitmapFormat *local_58;
  MthdPatternShape *local_50;
  MthdPatternBitmapColor *local_48;
  MthdPatternBitmapColor *local_40;
  MthdPatternBitmap *local_38;
  MthdPatternBitmap *local_30;
  iterator local_28;
  size_type local_20;
  Pattern *local_18;
  Pattern *this_local;
  
  local_18 = this;
  this_local = (Pattern *)__return_storage_ptr__;
  this_00 = (SingleMthdTest *)operator_new(0x25950);
  local_ba = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"nop",&local_b9);
  MthdNop::SingleMthdTest
            ((MthdNop *)this_00,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_b8,-1,
             (this->super_Class).cls,0x100,1,4);
  local_ba = 0;
  local_88 = this_00;
  this_01 = (MthdNotify *)operator_new(0x25950);
  local_e2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"notify",&local_e1);
  MthdNotify::SingleMthdTest
            (this_01,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_e0,0,
             (this->super_Class).cls,0x104,1,4);
  local_e2 = 0;
  local_80 = this_01;
  this_02 = (MthdPmTrigger *)operator_new(0x25950);
  local_10a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"pm_trigger",&local_109);
  MthdPmTrigger::SingleMthdTest
            (this_02,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_108,-1,
             (this->super_Class).cls,0x140,1,4);
  local_10a = 0;
  local_78 = this_02;
  this_03 = (MthdDmaNotify *)operator_new(0x25950);
  local_132 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"dma_notify",&local_131);
  MthdDmaNotify::SingleMthdTest
            (this_03,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_130,1,
             (this->super_Class).cls,0x180,1,4);
  local_132 = 0;
  local_70 = this_03;
  this_04 = (MthdMissing *)operator_new(0x25950);
  local_15a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"missing",&local_159);
  MthdMissing::SingleMthdTest
            (this_04,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_158,-1,
             (this->super_Class).cls,0x200,1,4);
  local_15a = 0;
  local_68 = this_04;
  this_05 = (MthdCtxFormat *)operator_new(0x25950);
  local_182 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"format",&local_181);
  MthdCtxFormat::SingleMthdTest
            (this_05,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_180,2,
             (this->super_Class).cls,0x300,1,4);
  local_182 = 0;
  local_60 = this_05;
  this_06 = (MthdBitmapFormat *)operator_new(0x25950);
  local_1aa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"bitmap_format",&local_1a9);
  MthdBitmapFormat::SingleMthdTest
            (this_06,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1a8,3,
             (this->super_Class).cls,0x304,1,4);
  local_1aa = 0;
  local_58 = this_06;
  this_07 = (MthdPatternShape *)operator_new(0x25950);
  local_1d2 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"pattern_shape",&local_1d1);
  MthdPatternShape::SingleMthdTest
            (this_07,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1d0,4,
             (this->super_Class).cls,0x308,1,4);
  local_1d2 = 0;
  local_50 = this_07;
  pMVar2 = (MthdPatternBitmapColor *)operator_new(0x25958);
  local_1fa = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"pattern_bitmap_color_0",&local_1f9);
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_1f8,5,
             (this->super_Class).cls,0x310,0);
  local_1fa = 0;
  local_48 = pMVar2;
  pMVar2 = (MthdPatternBitmapColor *)operator_new(0x25958);
  local_222 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"pattern_bitmap_color_1",&local_221);
  MthdPatternBitmapColor::MthdPatternBitmapColor
            (pMVar2,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_220,6,
             (this->super_Class).cls,0x314,1);
  local_222 = 0;
  local_40 = pMVar2;
  pMVar3 = (MthdPatternBitmap *)operator_new(0x25958);
  local_24a = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"pattern_bitmap_0",&local_249);
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_248,7,
             (this->super_Class).cls,0x318,0);
  local_24a = 0;
  local_38 = pMVar3;
  pMVar3 = (MthdPatternBitmap *)operator_new(0x25958);
  local_272 = 1;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(&(this->super_Class).rnd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"pattern_bitmap_1",&local_271);
  MthdPatternBitmap::MthdPatternBitmap
            (pMVar3,&(this->super_Class).opt,(uint32_t)rVar1,(string *)local_270,8,
             (this->super_Class).cls,0x31c,1);
  local_272 = 0;
  local_28 = &local_88;
  local_20 = 0xc;
  local_30 = pMVar3;
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::allocator(&local_273);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(__return_storage_ptr__,__l,&local_273);
  std::allocator<hwtest::pgraph::SingleMthdTest_*>::~allocator(&local_273);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SingleMthdTest *> Pattern::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdCtxFormat(opt, rnd(), "format", 2, cls, 0x300),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 3, cls, 0x304),
		new MthdPatternShape(opt, rnd(), "pattern_shape", 4, cls, 0x308),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_0", 5, cls, 0x310, 0),
		new MthdPatternBitmapColor(opt, rnd(), "pattern_bitmap_color_1", 6, cls, 0x314, 1),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_0", 7, cls, 0x318, 0),
		new MthdPatternBitmap(opt, rnd(), "pattern_bitmap_1", 8, cls, 0x31c, 1),
	};
}